

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcache_test.cc
# Opt level: O0

void multi_thread_test(int nblocks,int cachesize,int blocksize,int time_sec,int nwriters,
                      int nreaders)

{
  pthread_t __th;
  long lVar1;
  long lVar2;
  int iVar3;
  uint32_t uVar4;
  long lVar5;
  uint64_t *__s;
  void **__thread_return;
  filemgr_open_result fVar6;
  undefined8 uStack_150;
  char *local_148;
  filemgr *local_140;
  filemgr_open_result result;
  void **ret;
  worker_args *args;
  pthread_t *tid;
  char *fname;
  int r;
  uint8_t *buf;
  uint32_t crc;
  uint64_t j;
  uint64_t i;
  int local_e0;
  int n;
  filemgr_config config;
  filemgr *file;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  int nreaders_local;
  int nwriters_local;
  int time_sec_local;
  int blocksize_local;
  int cachesize_local;
  int nblocks_local;
  
  uStack_150 = 0x10419c;
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  iVar3 = nwriters + nreaders;
  lVar1 = -0x148 - ((long)iVar3 * 8 + 0xfU & 0xfffffffffffffff0);
  lVar2 = lVar1 - ((long)iVar3 * 0x28 + 0xfU & 0xfffffffffffffff0);
  lVar5 = (long)&local_148 + (lVar2 - ((long)iVar3 * 8 + 0xfU & 0xfffffffffffffff0)) + 0x148;
  result._8_8_ = lVar5;
  *(undefined8 *)(lVar5 + -8) = 0x104239;
  system("rm -rf  bcache_testfile");
  *(undefined8 *)(lVar5 + -8) = 0x104244;
  memleak_start();
  *(undefined8 *)(lVar5 + -8) = 0x10424e;
  __s = (uint64_t *)malloc(0x1000);
  *(undefined8 *)(lVar5 + -8) = 0x104268;
  memset(__s,0,0x1000);
  *(undefined8 *)(lVar5 + -8) = 0x10427b;
  memset(&local_e0,0,0x60);
  config.blocksize = 0;
  config.flag._0_1_ = 8;
  config.prefetch_duration._0_2_ = 8;
  local_148 = "./bcache_testfile";
  local_e0 = blocksize;
  n = cachesize;
  *(undefined8 *)(lVar5 + -8) = 0x1042ba;
  get_filemgr_ops();
  *(undefined8 *)(lVar5 + -8) = 0x1042d4;
  fVar6 = filemgr_open(*(char **)(lVar5 + 0x3d8),*(filemgr_ops **)(lVar5 + 0x3d0),
                       *(filemgr_config **)(lVar5 + 0x3c8),*(err_log_callback **)(lVar5 + 0x3c0));
  local_140 = fVar6.file;
  result.file._0_4_ = fVar6.rv;
  config._88_8_ = local_140;
  for (j = 0; j < (ulong)(long)nblocks; j = j + 1) {
    *__s = j;
    __s[1] = 0;
    *(undefined8 *)(lVar5 + -8) = 0x10434c;
    uVar4 = crc32_8(__s,0x10,0);
    *(uint32_t *)(__s + 2) = uVar4;
    *(undefined8 *)(lVar5 + -8) = 0x104384;
    bcache_write(*(filemgr **)(lVar5 + 0xb0),*(bid_t *)(lVar5 + 0xa8),*(void **)(lVar5 + 0xa0),
                 *(bcache_dirty_t *)(lVar5 + 0x9c),*(bool *)(lVar5 + 0x9b),*(bool *)(lVar5 + 0x9a));
  }
  for (j = 0; j < (ulong)(long)iVar3; j = j + 1) {
    *(uint64_t *)((long)&local_148 + j * 0x28 + lVar2 + 0x148) = j;
    *(undefined8 *)((long)&local_140 + j * 0x28 + lVar2 + 0x148) = config._88_8_;
    *(long *)((long)&result + j * 0x28 + lVar2 + 0x148) =
         (long)(int)(uint)(j < (ulong)(long)nwriters);
    *(long *)((long)&result + j * 0x28 + lVar2 + 0x150) = (long)nblocks;
    *(long *)((long)&ret + j * 0x28 + lVar2 + 0x148) = (long)time_sec;
    *(undefined8 *)(lVar5 + -8) = 0x10448f;
    pthread_create((pthread_t *)((long)&local_148 + j * 8 + lVar1 + 0x148),(pthread_attr_t *)0x0,
                   worker,(void *)((long)&local_148 + j * 0x28 + lVar2 + 0x148));
  }
  *(undefined8 *)(lVar5 + -8) = 0x1044b7;
  printf("wait for %d seconds..\n",(ulong)(uint)time_sec);
  for (j = 0; j < (ulong)(long)iVar3; j = j + 1) {
    __th = *(pthread_t *)((long)&local_148 + j * 8 + lVar1 + 0x148);
    __thread_return = (void **)(result._8_8_ + j * 8);
    *(undefined8 *)(lVar5 + -8) = 0x104501;
    pthread_join(__th,__thread_return);
  }
  *(undefined8 *)(lVar5 + -8) = 0x104527;
  filemgr_commit(*(filemgr **)(lVar5 + 0x18),*(bool *)(lVar5 + 0x17),
                 *(err_log_callback **)(lVar5 + 8));
  *(undefined8 *)(lVar5 + -8) = 0x10453c;
  filemgr_close(*(filemgr **)(lVar5 + 0x660),*(bool *)(lVar5 + 0x65f),*(char **)(lVar5 + 0x650),
                *(err_log_callback **)(lVar5 + 0x648));
  *(undefined8 *)(lVar5 + -8) = 0x104541;
  filemgr_shutdown();
  *(undefined8 *)(lVar5 + -8) = 0x10454d;
  free(__s);
  *(undefined8 *)(lVar5 + -8) = 0x104552;
  memleak_end();
  if (multi_thread_test::__test_pass == 0) {
    *(undefined8 *)(lVar5 + -8) = 0x10459b;
    fprintf(_stderr,"%s FAILED\n","multi thread test");
  }
  else {
    *(undefined8 *)(lVar5 + -8) = 0x10457a;
    fprintf(_stderr,"%s PASSED\n","multi thread test");
  }
  return;
}

Assistant:

void multi_thread_test(
    int nblocks, int cachesize, int blocksize, int time_sec, int nwriters, int nreaders)
{
    TEST_INIT();

    struct filemgr *file;
    struct filemgr_config config;
    int n = nwriters + nreaders;
    uint64_t i, j;
    uint32_t crc;
    uint8_t *buf;
    int r;
    char *fname = (char *) "./bcache_testfile";
    thread_t *tid = alca(thread_t, n);
    struct worker_args *args = alca(struct worker_args, n);
    void **ret = alca(void *, n);

    r = system(SHELL_DEL " bcache_testfile");
    (void)r;

    memleak_start();

    buf = (uint8_t *)malloc(4096);
    memset(buf, 0, 4096);

    memset(&config, 0, sizeof(config));
    config.blocksize = blocksize;
    config.ncacheblock = cachesize;
    config.flag = 0x0;
    config.options = FILEMGR_CREATE;
    config.num_wal_shards = 8;
    filemgr_open_result result = filemgr_open(fname, get_filemgr_ops(), &config, NULL);
    file = result.file;

    for (i=0;i<(uint64_t)nblocks;++i) {
        memcpy(buf, &i, sizeof(i));
        j = 0;
        memcpy(buf + sizeof(i), &j, sizeof(j));
        crc = crc32_8(buf, sizeof(i) + sizeof(j), 0);
        memcpy(buf + sizeof(i) + sizeof(j), &crc, sizeof(crc));
        bcache_write(file, (bid_t)i, buf, BCACHE_REQ_DIRTY, false, false);
    }

    for (i=0;i<(uint64_t)n;++i){
        args[i].n = i;
        args[i].file = file;
        args[i].writer = ((i<(uint64_t)nwriters)?(1):(0));
        args[i].nblocks = nblocks;
        args[i].time_sec = time_sec;
        thread_create(&tid[i], worker, &args[i]);
    }

    DBG("wait for %d seconds..\n", time_sec);
    for (i=0;i<(uint64_t)n;++i){
        thread_join(tid[i], &ret[i]);
    }

    filemgr_commit(file, true, NULL);
    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();
    free(buf);

    memleak_end();
    TEST_RESULT("multi thread test");
}